

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBInputTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBInputTest *this,GLuint test_case_index)

{
  QUALIFIERS QVar1;
  reference pvVar2;
  ostream *poVar3;
  GLchar *pGVar4;
  TestError *this_00;
  testCase *test_case;
  stringstream stream;
  ostream local_198;
  uint local_1c;
  XFBInputTest *pXStack_18;
  GLuint test_case_index_local;
  XFBInputTest *this_local;
  
  local_1c = test_case_index;
  pXStack_18 = this;
  this_local = (XFBInputTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&test_case);
  pvVar2 = std::
           vector<gl4cts::EnhancedLayouts::XFBInputTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInputTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)local_1c);
  poVar3 = std::operator<<(&local_198,"Stage: ");
  pGVar4 = Utils::Shader::GetStageName(pvVar2->m_stage);
  poVar3 = std::operator<<(poVar3,pGVar4);
  std::operator<<(poVar3,", qualifier: ");
  QVar1 = pvVar2->m_qualifier;
  if (QVar1 == BUFFER) {
    std::operator<<(&local_198,"xfb_buffer");
  }
  else if (QVar1 == STRIDE) {
    std::operator<<(&local_198,"xfb_stride");
  }
  else {
    if (QVar1 != OFFSET) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x4cc2);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::operator<<(&local_198,"xfb_offset");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&test_case);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBInputTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", qualifier: ";

	switch (test_case.m_qualifier)
	{
	case BUFFER:
		stream << "xfb_buffer";
		break;
	case OFFSET:
		stream << "xfb_offset";
		break;
	case STRIDE:
		stream << "xfb_stride";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return stream.str();
}